

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::LengthFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 uVar1;
  undefined4 uVar2;
  FunctionNullHandling in_stack_fffffffffffffac8;
  allocator_type local_531;
  bind_lambda_function_t in_stack_fffffffffffffad0;
  scalar_function_t local_518;
  scalar_function_t local_4f8;
  LogicalType local_4d0;
  _Any_data local_4b8;
  code *local_4a8;
  undefined8 uStack_4a0;
  LogicalType local_498;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_480;
  LogicalType local_468;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_450;
  LogicalType local_438;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_420;
  LogicalType local_408;
  LogicalType local_3f0;
  LogicalType local_3d8;
  string local_3c0;
  ScalarFunction local_3a0;
  ScalarFunction local_278;
  ScalarFunction local_150;
  
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"length","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffad0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffad0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_420,__l,(allocator_type *)&local_4d0);
  LogicalType::LogicalType(&local_438,BIGINT);
  local_4f8.super__Function_base._M_functor._8_8_ = 0;
  local_4f8.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::string_t,long,duckdb::StringLengthOperator>;
  local_4f8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_4f8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3d8,INVALID);
  uVar2 = 0;
  uVar1 = 0;
  ScalarFunction::ScalarFunction
            (&local_150,(vector<duckdb::LogicalType,_true> *)&local_420,&local_438,&local_4f8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,LengthPropagateStats,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_3d8),CONSISTENT,
             in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_150);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)&local_150.function,(_Any_data *)&local_150.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_3d8);
  if (local_4f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4f8.super__Function_base._M_manager)
              ((_Any_data *)&local_4f8,(_Any_data *)&local_4f8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_438);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_420);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffad0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffad0,BIT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffad0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_450,__l_00,(allocator_type *)&local_4d0);
  LogicalType::LogicalType(&local_468,BIGINT);
  local_518.super__Function_base._M_functor._8_8_ = 0;
  local_518.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::string_t,long,duckdb::BitStringLenOperator>;
  local_518._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_518.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3f0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_3f0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = uVar1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar2;
  ScalarFunction::ScalarFunction
            (&local_278,(vector<duckdb::LogicalType,_true> *)&local_450,&local_468,&local_518,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_278);
  local_278.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_278.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_278.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.function.super__Function_base._M_manager)
              ((_Any_data *)&local_278.function,(_Any_data *)&local_278.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_278.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_3f0);
  if (local_518.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_518.super__Function_base._M_manager)
              ((_Any_data *)&local_518,(_Any_data *)&local_518,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_468);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_450);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffad0);
  LogicalType::LogicalType(&local_4d0,ANY);
  LogicalType::LIST((LogicalType *)&stack0xfffffffffffffad0,&local_4d0);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&stack0xfffffffffffffad0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_480,__l_01,&local_531);
  LogicalType::LogicalType(&local_498,BIGINT);
  local_4a8 = (code *)0x0;
  uStack_4a0 = 0;
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_8_ = 0;
  LogicalType::LogicalType(&local_408,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_408;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = uVar1;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       uVar2;
  ScalarFunction::ScalarFunction
            (&local_3a0,(vector<duckdb::LogicalType,_true> *)&local_480,&local_498,
             (scalar_function_t *)&local_4b8,ArrayOrListLengthBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a0);
  local_3a0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_3a0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a0.function,(_Any_data *)&local_3a0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_408);
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_498);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_480);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffad0);
  LogicalType::~LogicalType(&local_4d0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LengthFun::GetFunctions() {
	ScalarFunctionSet length("length");
	length.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::BIGINT,
	                                  ScalarFunction::UnaryFunction<string_t, int64_t, StringLengthOperator>, nullptr,
	                                  nullptr, LengthPropagateStats));
	length.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIGINT,
	                                  ScalarFunction::UnaryFunction<string_t, int64_t, BitStringLenOperator>));
	length.AddFunction(
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::BIGINT, nullptr, ArrayOrListLengthBind));
	return (length);
}